

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.h
# Opt level: O2

void __thiscall anurbs::RTree<3L>::PickByBox::PickByBox(PickByBox *this,Vector *box_a,Vector *box_b)

{
  double dVar1;
  CoeffReturnType pdVar2;
  Scalar *pSVar3;
  double *pdVar4;
  Index i;
  long index;
  double local_30;
  
  for (index = 0; index != 3; index = index + 1) {
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0> *)box_a,index);
    dVar1 = *pdVar2;
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0> *)box_b,index);
    if (*pdVar2 <= dVar1) {
      pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0> *)box_b,index);
      dVar1 = *pdVar2;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)this,index);
      *pSVar3 = dVar1;
      pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0> *)box_a,index);
      local_30 = *pdVar2;
      pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)
                          &this->m_box_max,index);
    }
    else {
      pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0> *)box_a,index);
      dVar1 = *pdVar2;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)this,index);
      *pSVar3 = dVar1;
      pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0> *)box_b,index);
      local_30 = *pdVar2;
      pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)
                          &this->m_box_max,index);
    }
    *pdVar4 = local_30;
  }
  return;
}

Assistant:

PickByBox(const Vector box_a, const Vector box_b) noexcept
        {
            for (Index i = 0; i < TDimension; i++) {
                if (box_a[i] < box_b[i]) {
                    m_box_min[i] = box_a[i];
                    m_box_max[i] = box_b[i];
                } else {
                    m_box_min[i] = box_b[i];
                    m_box_max[i] = box_a[i];
                }
            }
        }